

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.cpp
# Opt level: O1

string * __thiscall
OutputIterations::get_current_iteration_string_abi_cxx11_
          (string *__return_storage_ptr__,OutputIterations *this)

{
  double dVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char str_buffer [100];
  char acStack_78 [104];
  
  dVar1 = (((this->iteration_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[this->current_iteration_index] * 0.5) /
          3.141592653589793) * 100.0;
  auVar7._8_8_ = 0x3fdfffffffffffff;
  auVar7._0_8_ = 0x3fdfffffffffffff;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = dVar1;
  auVar3 = vpternlogq_avx512vl(auVar7,auVar4,auVar3,0xf8);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1 + auVar3._0_8_;
  auVar3 = vroundsd_avx(auVar5,auVar5,0xb);
  auVar6._0_4_ = (int)auVar3._0_8_;
  auVar6._4_4_ = (int)auVar3._8_8_;
  auVar6._8_8_ = 0;
  auVar3 = vcvtdq2pd_avx(auVar6);
  sprintf(acStack_78,"%g",auVar3._0_8_ / 100.0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar2 = strlen(acStack_78);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_78,acStack_78 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string OutputIterations::get_current_iteration_string() const {
    const double ACCURACY = 100.;

    double value = static_cast<int>(round(get_current_iteration_time() / 2 / PI * ACCURACY)) / ACCURACY;

    char str_buffer[100];
    sprintf(str_buffer, "%g", value);
    return std::string(str_buffer);
}